

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O2

shared_ptr<Pipeline> __thiscall QPDFLogger::getError(QPDFLogger *this,bool null_okay)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *p;
  shared_ptr<Pipeline> sVar1;
  __shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  p = (__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)CONCAT71(in_register_00000031,null_okay) + 0x60);
  std::__shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_28,p);
  throwIfNull(this,(shared_ptr<Pipeline> *)p,SUB81(&_Stack_28,0));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  sVar1.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar1.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getError(bool null_okay)
{
    return throwIfNull(m->p_error, null_okay);
}